

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

int CompareXform(ON_Xform *a,ON_Xform *b)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double *db;
  double *da;
  
  lVar4 = 0;
  do {
    dVar1 = a->m_xform[0][lVar4];
    dVar2 = b->m_xform[0][lVar4];
    iVar3 = -1;
    if ((dVar2 <= dVar1) && (iVar3 = 1, dVar1 <= dVar2)) {
      iVar3 = 0;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        if (NAN(dVar1)) {
          iVar3 = -(uint)!NAN(dVar2);
        }
        else {
          iVar3 = -1;
          if (!NAN(dVar2)) {
            iVar3 = 0;
          }
        }
      }
    }
  } while (((int)lVar4 != 0xf) && (lVar4 = lVar4 + 1, iVar3 == 0));
  return iVar3;
}

Assistant:

static int CompareXform( const ON_Xform& a, const ON_Xform& b )
{
  int i,j;
  const double* da = &a.m_xform[0][0];
  const double* db = &b.m_xform[0][0];
  i = 16;
  j = 0;
  while ( i-- && !j)
  {
    j = CompareDouble(*da++,*db++);
  }

  return j;
}